

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O3

Ptr __thiscall
TgBot::TgTypeParser::parseJsonAndGetInputMessageContent(TgTypeParser *this,ptree *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 *puVar2;
  undefined1 *puVar3;
  element_type *peVar4;
  long *plVar5;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  type tVar6;
  type extraout_RDX;
  type extraout_RDX_00;
  type extraout_RDX_01;
  type extraout_RDX_02;
  type extraout_RDX_03;
  ptree *data_00;
  string *psVar7;
  Ptr PVar8;
  Ptr PVar9;
  Ptr PVar10;
  Ptr PVar11;
  Ptr PVar12;
  string tPnoneNumber;
  string tTitle;
  string tMessageText;
  path_type local_118;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  void **local_c0;
  long local_b8;
  void *local_b0 [2];
  element_type *local_a0;
  undefined1 *local_98;
  long local_90;
  undefined1 local_88 [16];
  type local_78;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  undefined1 local_48 [8];
  undefined1 local_40 [16];
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  paVar1 = &local_118.m_value.field_2;
  local_118.m_value._M_dataplus._M_p = (pointer)paVar1;
  local_a0 = (element_type *)this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"message_text","");
  local_118.m_separator = '.';
  local_118.m_start._M_current = local_118.m_value._M_dataplus._M_p;
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_optional<std::__cxx11::string>
            (&local_e8,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)in_RDX,&local_118);
  puVar2 = (undefined1 *)((long)&local_e8 + 8);
  psVar7 = (string *)&local_98;
  if (local_e8.super_type.m_initialized != false) {
    psVar7 = (string *)puVar2;
  }
  local_70 = local_60;
  puVar3 = (undefined1 *)((long)&local_e8 + 0x10);
  plVar5 = &local_90;
  if (local_e8.super_type.m_initialized != false) {
    plVar5 = (long *)puVar3;
  }
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,*(long *)psVar7,*plVar5 + *(long *)psVar7);
  if ((local_e8.super_type.m_initialized == true) &&
     (local_e8.super_type.m_storage.dummy_.aligner_ != (type)((long)&local_e8 + 0x18U))) {
    operator_delete((void *)local_e8.super_type.m_storage.dummy_.aligner_);
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_118.m_value._M_dataplus._M_p);
  }
  local_118.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"latitude","");
  local_118.m_separator = '.';
  local_118.m_start._M_current = local_118.m_value._M_dataplus._M_p;
  local_78 = (type)boost::property_tree::
                   basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::get_optional<float>(in_RDX,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_118.m_value._M_dataplus._M_p);
  }
  local_118.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"title","");
  local_118.m_separator = '.';
  local_118.m_start._M_current = local_118.m_value._M_dataplus._M_p;
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_optional<std::__cxx11::string>
            (&local_e8,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)in_RDX,&local_118);
  local_98 = local_88;
  psVar7 = (string *)&local_c0;
  if (local_e8.super_type.m_initialized != false) {
    psVar7 = (string *)puVar2;
  }
  plVar5 = &local_b8;
  if (local_e8.super_type.m_initialized != false) {
    plVar5 = (long *)puVar3;
  }
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,*(long *)psVar7,*plVar5 + *(long *)psVar7);
  if ((local_e8.super_type.m_initialized == true) &&
     (local_e8.super_type.m_storage.dummy_.aligner_ != (type)((long)&local_e8 + 0x18U))) {
    operator_delete((void *)local_e8.super_type.m_storage.dummy_.aligner_);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_118.m_value._M_dataplus._M_p);
  }
  local_118.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"phone_number","");
  local_118.m_separator = '.';
  local_118.m_start._M_current = local_118.m_value._M_dataplus._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_optional<std::__cxx11::string>
            (&local_e8,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)in_RDX,&local_118);
  local_c0 = local_b0;
  psVar7 = (string *)&local_50;
  if (local_e8.super_type.m_initialized != false) {
    psVar7 = (string *)puVar2;
  }
  data_00 = *(ptree **)psVar7;
  plVar5 = (long *)local_48;
  if (local_e8.super_type.m_initialized != false) {
    plVar5 = (long *)puVar3;
  }
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,data_00,(long)&(data_00->m_data)._M_dataplus._M_p + *plVar5);
  if ((local_e8.super_type.m_initialized == true) &&
     (local_e8.super_type.m_storage.dummy_.aligner_ != (type)((long)&local_e8 + 0x18U))) {
    operator_delete((void *)local_e8.super_type.m_storage.dummy_.aligner_);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  peVar4 = local_a0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_118.m_value._M_dataplus._M_p);
  }
  if (local_68 == 0) {
    if (local_90 == 0) {
      if ((local_78.m_storage != 1000.0 & local_78.m_initialized) == 1) {
        PVar10 = parseJsonAndGetInputLocationMessageContent((TgTypeParser *)&local_118,data_00);
        tVar6 = (type)PVar10.
                      super___shared_ptr<TgBot::InputLocationMessageContent,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
      }
      else {
        tVar6 = local_78;
        if (local_b8 == 0) goto LAB_001c5c11;
        PVar11 = parseJsonAndGetInputContactMessageContent((TgTypeParser *)&local_118,data_00);
        tVar6 = (type)PVar11.
                      super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
      }
    }
    else {
      PVar9 = parseJsonAndGetInputVenueMessageContent((TgTypeParser *)&local_118,data_00);
      tVar6 = (type)PVar9.
                    super___shared_ptr<TgBot::InputVenueMessageContent,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
    }
  }
  else {
    PVar8 = parseJsonAndGetInputTextMessageContent((TgTypeParser *)&local_118,data_00);
    tVar6 = (type)PVar8.
                  super___shared_ptr<TgBot::InputTextMessageContent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118.m_value._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    tVar6 = (type)&__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_118.m_value._M_string_length + 8) =
           *(_Atomic_word *)(local_118.m_value._M_string_length + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_118.m_value._M_string_length + 8) =
           *(_Atomic_word *)(local_118.m_value._M_string_length + 8) + 1;
    }
  }
  peVar4->_vptr_InputMessageContent = (_func_int **)local_118.m_value._M_dataplus._M_p;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(peVar4->type)._M_dataplus._M_p;
  (peVar4->type)._M_dataplus._M_p = (pointer)local_118.m_value._M_string_length;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    tVar6 = extraout_RDX;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118.m_value._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118.m_value._M_string_length);
    tVar6 = extraout_RDX_00;
  }
LAB_001c5c11:
  if (local_c0 != local_b0) {
    operator_delete(local_c0);
    tVar6 = extraout_RDX_01;
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
    tVar6 = extraout_RDX_02;
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
    tVar6 = extraout_RDX_03;
  }
  PVar12.super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)tVar6;
  PVar12.super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  return (Ptr)PVar12.super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

InputMessageContent::Ptr TgTypeParser::parseJsonAndGetInputMessageContent(const boost::property_tree::ptree& data) const {
    InputMessageContent::Ptr result;
    // define InputMessageContent type

    string tMessageText = data.get<string>("message_text", "");
    float tLatitude = data.get<float>("latitude", 1000); // latitude belong (-90,90)
    string tTitle = data.get<string>("title", "");
    string tPnoneNumber = data.get<string>("phone_number", "");

    if (!tMessageText.empty()) {
        result = static_pointer_cast<InputMessageContent>(parseJsonAndGetInputTextMessageContent(data));
    } else if (!tTitle.empty()) {
        result = static_pointer_cast<InputMessageContent>(parseJsonAndGetInputVenueMessageContent(data));
    } else if (tLatitude != 1000) {
        result = static_pointer_cast<InputMessageContent>(parseJsonAndGetInputLocationMessageContent(data));
    } else if (!tPnoneNumber.empty()) {
        result = static_pointer_cast<InputMessageContent>(parseJsonAndGetInputContactMessageContent(data));
    }

    return result;
}